

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

idx_t duckdb::BitStringAggOperation::GetRange<duckdb::uhugeint_t>(uhugeint_t min,uhugeint_t max)

{
  bool bVar1;
  uhugeint_t uVar2;
  uhugeint_t input;
  idx_t range;
  uhugeint_t result;
  uhugeint_t local_28;
  uhugeint_t local_18;
  
  bVar1 = TrySubtractOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (max,min,&result);
  if (bVar1) {
    uhugeint_t::uhugeint_t(&local_18,1);
    uVar2 = uhugeint_t::operator+(&result,&local_18);
    input.upper = (uint64_t)&range;
    input.lower = uVar2.upper;
    bVar1 = Uhugeint::TryCast<unsigned_long>((Uhugeint *)uVar2.lower,input,&range);
    if (bVar1) {
      local_28.lower._0_4_ = 0xffffffff;
      local_28.lower._4_4_ = 0xffffffff;
      local_28.upper._0_4_ = 0xffffffff;
      local_28.upper._4_4_ = 0xffffffff;
      bVar1 = uhugeint_t::operator==(&result,&local_28);
      if (!bVar1) {
        return range;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t BitStringAggOperation::GetRange(uhugeint_t min, uhugeint_t max) {
	uhugeint_t result;
	if (!TrySubtractOperator::Operation(max, min, result)) {
		return NumericLimits<idx_t>::Maximum();
	}
	idx_t range;
	if (!Uhugeint::TryCast(result + 1, range) || result == NumericLimits<uhugeint_t>::Maximum()) {
		return NumericLimits<idx_t>::Maximum();
	}
	return range;
}